

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O3

void G_VerifySkill(void)

{
  uint uVar1;
  UCVarValue value;
  
  if (gameskill.Value < (int)AllSkills.Count) {
    if (-1 < gameskill.Value) {
      return;
    }
    uVar1 = 0;
  }
  else {
    uVar1 = AllSkills.Count - 1;
  }
  value._4_4_ = 0;
  value.Int = uVar1;
  FBaseCVar::SetGenericRep(&gameskill.super_FBaseCVar,value,CVAR_Int);
  return;
}

Assistant:

inline operator int () const { return Value; }